

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O2

void tc(void)

{
  int got;
  int got_00;
  int iVar1;
  bool bVar2;
  char buf [128];
  
  printf("SPI tests.");
  got = spi_open(1,50000,0);
  CHECK(0xc,1,got,0,0,"spi open");
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    buf[2] = '\0';
    buf[0] = '\x01';
    buf[1] = -0x80;
    got_00 = spi_xfer(got,buf,buf,3);
    CHECK(0xc,2,got_00,3,0,"spi xfer");
    if (got_00 == 3) {
      time_sleep(0x3ff0000000000000);
      printf("%d ",(ulong)((int)buf[2] | ((byte)buf[1] & 0xf) << 8));
    }
  }
  iVar1 = spi_close(got);
  CHECK(0xc,99,iVar1,0,0,"spi close");
  return;
}

Assistant:

void tc()
{
   int h, x, b, e;
   char buf[128];

   printf("SPI tests.");

   /* this test requires a MCP3202 on SPI channel 1 */

   h = spi_open(1, 50000, 0);
   CHECK(12, 1, h, 0, 0, "spi open");


   for (x=0; x<5; x++)
   {
      sprintf(buf, "\x01\x80");
      b = spi_xfer(h, buf, buf, 3);
      CHECK(12, 2, b, 3, 0, "spi xfer");
      if (b == 3)
      {
         time_sleep(1.0);
         printf("%d ", ((buf[1]&0x0F)*256)|buf[2]);
      }
   }

   e = spi_close(h);
   CHECK(12, 99, e, 0, 0, "spi close");
}